

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::WrapperFieldGenerator
          (WrapperFieldGenerator *this,FieldDescriptor *descriptor,int presenceIndex,
          Options *options)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FieldDescriptor *pFVar2;
  FieldDescriptor FVar3;
  FieldDescriptor *descriptor_00;
  long *plVar4;
  mapped_type *pmVar5;
  Descriptor *pDVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  string local_90;
  undefined1 local_70 [32];
  key_type local_50;
  
  FieldGeneratorBase::FieldGeneratorBase
            (&this->super_FieldGeneratorBase,descriptor,presenceIndex,options);
  (this->super_FieldGeneratorBase).super_SourceGeneratorBase._vptr_SourceGeneratorBase =
       (_func_int **)&PTR__WrapperOneofFieldGenerator_004dcd78;
  FieldGeneratorBase::name_abi_cxx11_((string *)local_70,&this->super_FieldGeneratorBase);
  plVar4 = (long *)std::__cxx11::string::append(local_70);
  paVar1 = &local_90.field_2;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 == paVar7) {
    local_90.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_90.field_2._8_4_ = (undefined4)plVar4[3];
    local_90.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
    local_90._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_90._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_90._M_string_length = plVar4[1];
  *plVar4 = (long)paVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  paVar7 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"has_property_check","");
  this_00 = &(this->super_FieldGeneratorBase).variables_;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_50);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar7) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  pFVar2 = (FieldDescriptor *)(local_70 + 0x10);
  if ((FieldDescriptor *)local_70._0_8_ != pFVar2) {
    operator_delete((void *)local_70._0_8_);
  }
  FieldGeneratorBase::name_abi_cxx11_((string *)local_70,&this->super_FieldGeneratorBase);
  plVar4 = (long *)std::__cxx11::string::append(local_70);
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 == paVar8) {
    local_90.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_90.field_2._8_4_ = (undefined4)plVar4[3];
    local_90.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
    local_90._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_90._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_90._M_string_length = plVar4[1];
  *plVar4 = (long)paVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_50._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"has_not_property_check","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_50);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar7) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((FieldDescriptor *)local_70._0_8_ != pFVar2) {
    operator_delete((void *)local_70._0_8_);
  }
  pDVar6 = FieldDescriptor::message_type(descriptor);
  descriptor_00 = *(FieldDescriptor **)(pDVar6 + 0x28);
  if (*(once_flag **)(descriptor_00 + 0x18) != (once_flag *)0x0) {
    local_90._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_70._0_8_ = descriptor_00;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(descriptor_00 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_90,
               (FieldDescriptor **)local_70);
  }
  if (descriptor_00[2] == (FieldDescriptor)0x9) {
    this->is_value_type = false;
  }
  else {
    if (*(once_flag **)(descriptor_00 + 0x18) != (once_flag *)0x0) {
      local_90._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_70._0_8_ = descriptor_00;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(descriptor_00 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_90,
                 (FieldDescriptor **)local_70);
    }
    FVar3 = descriptor_00[2];
    this->is_value_type = FVar3 != (FieldDescriptor)0xc;
    if (FVar3 != (FieldDescriptor)0xc) {
      FieldGeneratorBase::type_name_abi_cxx11_
                (&local_90,&this->super_FieldGeneratorBase,descriptor_00);
      local_70._0_8_ = pFVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"nonnullable_type_name","")
      ;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,(key_type *)local_70);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_90);
      if ((FieldDescriptor *)local_70._0_8_ != pFVar2) {
        operator_delete((void *)local_70._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

WrapperFieldGenerator::WrapperFieldGenerator(const FieldDescriptor* descriptor,
                                       int presenceIndex, const Options *options)
    : FieldGeneratorBase(descriptor, presenceIndex, options) {
  variables_["has_property_check"] = name() + "_ != null";
  variables_["has_not_property_check"] = name() + "_ == null";
  const FieldDescriptor* wrapped_field = descriptor->message_type()->field(0);
  is_value_type = wrapped_field->type() != FieldDescriptor::TYPE_STRING &&
      wrapped_field->type() != FieldDescriptor::TYPE_BYTES;
  if (is_value_type) {
    variables_["nonnullable_type_name"] = type_name(wrapped_field);
  }
}